

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

void kwssys::SystemTools::AddTranslationPath(string *a,string *b)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  size_type sVar9;
  _Alloc_hider _Var10;
  string path_b;
  string path_a;
  string local_b0;
  string local_90;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  paVar1 = &local_90.field_2;
  pcVar5 = (a->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,pcVar5,pcVar5 + a->_M_string_length)
  ;
  paVar2 = &local_b0.field_2;
  pcVar5 = (b->_M_dataplus)._M_p;
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b0,pcVar5,pcVar5 + b->_M_string_length)
  ;
  ConvertToUnixSlashes(&local_90);
  ConvertToUnixSlashes(&local_b0);
  bVar6 = FileIsDirectory(&local_90);
  if ((((bVar6) && (local_b0._M_string_length != 0)) &&
      ((*local_b0._M_dataplus._M_p == '~' || (*local_b0._M_dataplus._M_p == '/')))) &&
     (lVar8 = std::__cxx11::string::find((char *)&local_b0,0x17560b,0), lVar8 == -1)) {
    if ((local_90._M_string_length != 0) &&
       (local_90._M_dataplus._M_p[local_90._M_string_length - 1] != '/')) {
      std::__cxx11::string::push_back((char)&local_90);
    }
    if (local_b0._M_string_length == 0) {
      if (local_90._M_string_length == 0) goto LAB_0016406d;
      sVar9 = 0;
      _Var10._M_p = local_90._M_dataplus._M_p;
    }
    else {
      if (local_b0._M_dataplus._M_p[local_b0._M_string_length - 1] != '/') {
        std::__cxx11::string::push_back((char)&local_b0);
      }
      _Var10._M_p = local_90._M_dataplus._M_p;
      sVar9 = local_b0._M_string_length;
      if ((local_90._M_string_length == local_b0._M_string_length) &&
         ((local_b0._M_string_length == 0 ||
          (iVar7 = bcmp(local_90._M_dataplus._M_p,local_b0._M_dataplus._M_p,
                        local_b0._M_string_length), iVar7 == 0)))) goto LAB_0016406d;
    }
    paVar3 = &local_70.first.field_2;
    local_70.first._M_dataplus._M_p = _Var10._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var10._M_p == paVar1) {
      local_70.first.field_2._8_8_ = local_90.field_2._8_8_;
      local_70.first._M_dataplus._M_p = (pointer)paVar3;
    }
    paVar4 = &local_70.second.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == paVar2) {
      local_70.second.field_2._8_8_ = local_b0.field_2._8_8_;
      local_70.second._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_70.second._M_dataplus._M_p = local_b0._M_dataplus._M_p;
    }
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    local_90._M_dataplus._M_p = (pointer)paVar1;
    local_70.second._M_string_length = sVar9;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
              (SystemToolsStatics,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.second._M_dataplus._M_p != paVar4) {
      operator_delete(local_70.second._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.first._M_dataplus._M_p != paVar3) {
      operator_delete(local_70.first._M_dataplus._M_p);
    }
  }
LAB_0016406d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return;
}

Assistant:

void SystemTools::AddTranslationPath(const std::string& a,
                                     const std::string& b)
{
  std::string path_a = a;
  std::string path_b = b;
  SystemTools::ConvertToUnixSlashes(path_a);
  SystemTools::ConvertToUnixSlashes(path_b);
  // First check this is a directory path, since we don't want the table to
  // grow too fat
  if (SystemTools::FileIsDirectory(path_a)) {
    // Make sure the path is a full path and does not contain no '..'
    // Ken--the following code is incorrect. .. can be in a valid path
    // for example  /home/martink/MyHubba...Hubba/Src
    if (SystemTools::FileIsFullPath(path_b) &&
        path_b.find("..") == std::string::npos) {
      // Before inserting make sure path ends with '/'
      if (!path_a.empty() && path_a.back() != '/') {
        path_a += '/';
      }
      if (!path_b.empty() && path_b.back() != '/') {
        path_b += '/';
      }
      if (!(path_a == path_b)) {
        SystemToolsStatics->TranslationMap.insert(
          SystemToolsStatic::StringMap::value_type(std::move(path_a),
                                                   std::move(path_b)));
      }
    }
  }
}